

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O0

PageMemoryData * MemoryProfiler::GetPageMemoryData(PageAllocatorType type)

{
  bool bVar1;
  MemoryProfiler *pMVar2;
  MemoryProfiler *memoryProfiler;
  PageMemoryData *pPStack_10;
  PageAllocatorType type_local;
  
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)Js::Configuration::Global,TraceMemoryFlag);
  if (bVar1) {
    if (type == PageAllocatorType_Max) {
      pPStack_10 = (PageMemoryData *)0x0;
    }
    else {
      pMVar2 = EnsureMemoryProfiler();
      pPStack_10 = pMVar2->pageMemoryData + type;
    }
  }
  else {
    pPStack_10 = (PageMemoryData *)0x0;
  }
  return pPStack_10;
}

Assistant:

PageMemoryData *
MemoryProfiler::GetPageMemoryData(PageAllocatorType type)
{
    if (!Js::Configuration::Global.flags.IsEnabled(Js::TraceMemoryFlag))
    {
        return nullptr;
    }
    if (type == PageAllocatorType_Max)
    {
        return nullptr;
    }
    MemoryProfiler * memoryProfiler = EnsureMemoryProfiler();
    return &memoryProfiler->pageMemoryData[type];
}